

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  parasail_result_t *ppVar7;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int32_t *piVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  char *__format;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar52 [16];
  int iVar56;
  int iVar58;
  undefined1 in_XMM13 [16];
  undefined1 auVar57 [16];
  int iVar59;
  int32_t *local_1e0;
  undefined1 local_1b8 [16];
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  ulong local_180;
  ulong local_178;
  long local_170;
  long local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  long local_110;
  long local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 local_48 [16];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "_s2";
LAB_0065e8b9:
    fprintf(_stderr,__format,"parasail_sg_flags_table_diag_sse41_128_32",pcVar13);
    return (parasail_result_t *)0x0;
  }
  uVar26 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar13 = "s2Len";
    goto LAB_0065e8b9;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar13 = "open";
    goto LAB_0065e8b9;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar13 = "gap";
    goto LAB_0065e8b9;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "matrix";
    goto LAB_0065e8b9;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "_s1";
      goto LAB_0065e8b9;
    }
    uVar16 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar13 = "_s1Len";
      goto LAB_0065e8b9;
    }
  }
  else {
    uVar16 = (ulong)(uint)matrix->length;
  }
  iVar15 = (int)uVar16;
  uVar17 = s2Len + 3;
  iVar23 = -open;
  iVar19 = matrix->min;
  uVar18 = 0x80000000 - iVar19;
  if (iVar19 != iVar23 && SBORROW4(iVar19,iVar23) == iVar19 + open < 0) {
    uVar18 = open | 0x80000000;
  }
  iVar19 = uVar18 + 1;
  uVar18 = 0x7ffffffe - matrix->max;
  local_158 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_d8 = gap << 2;
    iStack_d4 = gap << 2;
    iStack_d0 = gap << 2;
    iStack_cc = gap << 2;
  }
  else {
    local_d8 = 0;
    iStack_d4 = 0;
    iStack_d0 = 0;
    iStack_cc = 0;
  }
  local_128._0_8_ = CONCAT44(iVar19,iVar19);
  local_128._8_8_ = CONCAT44(iVar19,iVar19);
  local_138._8_8_ = local_128._8_8_;
  local_138._0_8_ = local_128._0_8_;
  local_c8._8_8_ = local_128._8_8_;
  local_c8._0_8_ = local_128._0_8_;
  local_148._8_8_ = local_128._8_8_;
  local_148._0_8_ = local_128._0_8_;
  if (s1_beg == 0) {
    local_158._4_4_ = iVar23 + gap * -2;
    local_158._0_4_ = gap * -3 - open;
    local_158._12_4_ = iVar23;
    local_158._8_4_ = iVar23 - gap;
  }
  local_58 = gap;
  iStack_54 = gap;
  iStack_50 = gap;
  iStack_4c = gap;
  ppVar7 = parasail_result_new_table1(iVar15,s2Len);
  if (ppVar7 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar7->flag | 0x4421002;
  uVar25 = (ulong)(s2Len + 6);
  ptr = parasail_memalign_int32_t(0x10,uVar25);
  ptr_00 = parasail_memalign_int32_t(0x10,uVar25);
  ptr_01 = parasail_memalign_int32_t(0x10,uVar25);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  lVar27 = (long)iVar15;
  if (matrix->type == 0) {
    local_1e0 = parasail_memalign_int32_t(0x10,(long)(iVar15 + 3));
    uVar25 = 0;
    if (local_1e0 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    uVar12 = 0;
    if (0 < iVar15) {
      uVar12 = uVar16;
    }
    for (; lVar10 = lVar27, uVar12 != uVar25; uVar25 = uVar25 + 1) {
      local_1e0[uVar25] = matrix->mapper[(byte)_s1[uVar25]];
    }
    for (; lVar10 < iVar15 + 3; lVar10 = lVar10 + 1) {
      local_1e0[lVar10] = 0;
    }
  }
  else {
    local_1e0 = (int32_t *)0x0;
  }
  local_e8 = uVar18;
  uStack_e4 = uVar18;
  uStack_e0 = uVar18;
  uStack_dc = uVar18;
  local_98 = open;
  iStack_94 = open;
  iStack_90 = open;
  iStack_8c = open;
  local_68 = iVar15;
  iStack_64 = iVar15;
  iStack_60 = iVar15;
  iStack_5c = iVar15;
  local_a8._0_4_ = iVar15 + -1;
  local_a8._4_4_ = iVar15 + -1;
  local_a8._8_4_ = iVar15 + -1;
  local_a8._12_4_ = iVar15 + -1;
  local_88 = s2Len;
  iStack_84 = s2Len;
  iStack_80 = s2Len;
  iStack_7c = s2Len;
  local_78 = s2Len + -1;
  iStack_74 = s2Len + -1;
  iStack_70 = s2Len + -1;
  iStack_6c = s2Len + -1;
  piVar2 = matrix->mapper;
  for (uVar16 = 0; uVar26 != uVar16; uVar16 = uVar16 + 1) {
    ptr[uVar16 + 3] = piVar2[(byte)_s2[uVar16]];
  }
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    ptr[lVar10] = 0;
  }
  piVar11 = ptr + uVar26 + 3;
  for (uVar16 = uVar26; (int)uVar16 < (int)uVar17; uVar16 = (ulong)((int)uVar16 + 1)) {
    *piVar11 = 0;
    piVar11 = piVar11 + 1;
  }
  uVar16 = 0;
  iVar20 = iVar23;
  if (s2_beg == 0) {
    for (; uVar26 != uVar16; uVar16 = uVar16 + 1) {
      ptr_00[uVar16 + 3] = iVar20;
      ptr_01[uVar16 + 3] = iVar19;
      iVar20 = iVar20 - gap;
    }
  }
  else {
    for (; uVar26 != uVar16; uVar16 = uVar16 + 1) {
      ptr_00[uVar16 + 3] = 0;
      ptr_01[uVar16 + 3] = iVar19;
    }
  }
  for (lVar10 = 0; uVar16 = uVar26, lVar10 != 3; lVar10 = lVar10 + 1) {
    ptr_00[lVar10] = iVar19;
    ptr_01[lVar10] = iVar19;
  }
  for (; (int)uVar16 < (int)uVar17; uVar16 = uVar16 + 1) {
    ptr_00[uVar16 + 3] = iVar19;
    ptr_01[uVar16 + 3] = iVar19;
  }
  ptr_00[2] = 0;
  uVar8 = iVar15 - 1;
  auVar4._4_4_ = iVar19;
  auVar4._0_4_ = iVar19;
  auVar4._8_4_ = iVar19;
  local_c8._12_4_ = iVar19;
  local_c8._0_12_ = auVar4;
  local_b8 = local_c8 >> 0x20;
  auVar6 = local_b8;
  if ((int)uVar17 < 1) {
    uVar17 = 0;
  }
  local_168 = uVar26 * 0xc + -0xc;
  local_108 = uVar26 * 0x10;
  local_110 = uVar26 * 4;
  auVar57 = pmovsxbd(in_XMM13,0x10203);
  local_170 = 0;
  uVar16 = 0;
  auVar45 = local_a8;
  auVar31 = local_c8;
  auVar36 = local_c8;
  local_148 = local_c8;
  local_48 = local_c8;
  local_1b8 = local_c8;
  local_1a8 = uVar18;
  uStack_1a4 = uVar18;
  uStack_1a0 = uVar18;
  uStack_19c = uVar18;
  while ((long)uVar16 < lVar27) {
    uVar25 = uVar16 | 3;
    uVar39 = (uint)uVar16;
    if (matrix->type == 0) {
      uVar9 = local_1e0[uVar16 + 1];
      uVar14 = local_1e0[uVar16 + 2];
      uVar24 = local_1e0[uVar16];
      uVar22 = local_1e0[uVar25];
    }
    else {
      uVar9 = uVar8;
      if ((long)(uVar16 | 1) < lVar27) {
        uVar9 = uVar39 | 1;
      }
      uVar14 = uVar39 | 2;
      if (lVar27 <= (long)(uVar16 | 2)) {
        uVar14 = uVar8;
      }
      uVar24 = uVar39;
      uVar22 = uVar39 | 3;
      if (lVar27 <= (long)uVar25) {
        uVar22 = uVar8;
      }
    }
    local_178 = uVar16 | 1;
    local_180 = uVar16 | 2;
    piVar2 = matrix->matrix;
    iVar20 = matrix->size;
    local_b8._0_8_ = auVar4._4_8_;
    auVar37._12_4_ = ptr_00[2];
    auVar37._8_4_ = iVar19;
    auVar37._0_8_ = local_b8._0_8_;
    iVar56 = iVar23 - uVar39 * gap;
    if (s1_beg != 0) {
      iVar56 = 0;
    }
    auVar46._12_4_ = iVar56;
    auVar46._8_4_ = iVar19;
    auVar46._0_8_ = local_b8._0_8_;
    local_100 = uVar16 + 4;
    ptr_00[2] = iVar23 - (int)(uVar16 + 4) * gap;
    local_f8 = local_110 * local_180 + -8;
    local_f0 = local_110 * local_178 + -4;
    iVar56 = auVar57._0_4_;
    auVar48._0_4_ = -(uint)(local_a8._0_4_ == iVar56);
    iVar58 = auVar57._4_4_;
    auVar48._4_4_ = -(uint)(local_a8._4_4_ == iVar58);
    iVar21 = auVar57._8_4_;
    auVar48._8_4_ = -(uint)(local_a8._8_4_ == iVar21);
    iVar59 = auVar57._12_4_;
    auVar48._12_4_ = -(uint)(local_a8._12_4_ == iVar59);
    uVar16 = 0;
    auVar50._4_4_ = iVar19;
    auVar50._0_4_ = iVar19;
    auVar50._8_4_ = iVar19;
    auVar50._12_4_ = iVar19;
    auVar45 = pmovsxbd(auVar45,0xfffefd);
    auVar52 = auVar50;
    for (; uVar17 != uVar16; uVar16 = uVar16 + 1) {
      iVar1 = ptr_00[uVar16 + 3];
      iVar28 = auVar46._4_4_ - open;
      iVar32 = auVar46._8_4_ - open;
      iVar33 = auVar46._12_4_ - open;
      iVar34 = iVar1 - open;
      iVar51 = auVar52._4_4_ - local_58;
      iVar53 = auVar52._8_4_ - iStack_54;
      iVar54 = auVar52._12_4_ - iStack_50;
      iVar55 = ptr_01[uVar16 + 3] - iStack_4c;
      auVar52._0_4_ = (uint)(iVar51 < iVar28) * iVar28 | (uint)(iVar51 >= iVar28) * iVar51;
      auVar52._4_4_ = (uint)(iVar53 < iVar32) * iVar32 | (uint)(iVar53 >= iVar32) * iVar53;
      auVar52._8_4_ = (uint)(iVar54 < iVar33) * iVar33 | (uint)(iVar54 >= iVar33) * iVar54;
      auVar52._12_4_ = (uint)(iVar55 < iVar34) * iVar34 | (uint)(iVar55 >= iVar34) * iVar55;
      iVar28 = auVar46._0_4_ - open;
      iVar32 = auVar46._4_4_ - open;
      iVar33 = auVar46._8_4_ - open;
      iVar34 = auVar46._12_4_ - open;
      iVar51 = auVar50._0_4_ - local_58;
      iVar53 = auVar50._4_4_ - iStack_54;
      iVar54 = auVar50._8_4_ - iStack_50;
      iVar55 = auVar50._12_4_ - iStack_4c;
      auVar49._0_4_ = (uint)(iVar51 < iVar28) * iVar28 | (uint)(iVar51 >= iVar28) * iVar51;
      auVar49._4_4_ = (uint)(iVar53 < iVar32) * iVar32 | (uint)(iVar53 >= iVar32) * iVar53;
      auVar49._8_4_ = (uint)(iVar54 < iVar33) * iVar33 | (uint)(iVar54 >= iVar33) * iVar54;
      auVar49._12_4_ = (uint)(iVar55 < iVar34) * iVar34 | (uint)(iVar55 >= iVar34) * iVar55;
      iVar28 = piVar2[(long)(int)(uVar22 * iVar20) + (long)ptr[uVar16]] + auVar37._0_4_;
      iVar32 = piVar2[(long)(int)(uVar14 * iVar20) + (long)ptr[uVar16 + 1]] + auVar37._4_4_;
      iVar33 = piVar2[(long)(int)(uVar9 * iVar20) + (long)ptr[uVar16 + 2]] + auVar37._8_4_;
      iVar34 = piVar2[(long)(int)(uVar24 * iVar20) + (long)ptr[uVar16 + 3]] + auVar37._12_4_;
      uVar39 = ((int)auVar49._0_4_ < (int)auVar52._0_4_) * auVar52._0_4_ |
               ((int)auVar49._0_4_ >= (int)auVar52._0_4_) * auVar49._0_4_;
      uVar42 = ((int)auVar49._4_4_ < (int)auVar52._4_4_) * auVar52._4_4_ |
               ((int)auVar49._4_4_ >= (int)auVar52._4_4_) * auVar49._4_4_;
      uVar43 = ((int)auVar49._8_4_ < (int)auVar52._8_4_) * auVar52._8_4_ |
               ((int)auVar49._8_4_ >= (int)auVar52._8_4_) * auVar49._8_4_;
      uVar44 = ((int)auVar49._12_4_ < (int)auVar52._12_4_) * auVar52._12_4_ |
               ((int)auVar49._12_4_ >= (int)auVar52._12_4_) * auVar49._12_4_;
      auVar40._0_4_ = (uint)((int)uVar39 < iVar28) * iVar28 | ((int)uVar39 >= iVar28) * uVar39;
      auVar40._4_4_ = (uint)((int)uVar42 < iVar32) * iVar32 | ((int)uVar42 >= iVar32) * uVar42;
      auVar40._8_4_ = (uint)((int)uVar43 < iVar33) * iVar33 | ((int)uVar43 >= iVar33) * uVar43;
      auVar40._12_4_ = (uint)((int)uVar44 < iVar34) * iVar34 | ((int)uVar44 >= iVar34) * uVar44;
      iVar51 = auVar45._0_4_;
      auVar29._0_4_ = -(uint)(iVar51 == -1);
      iVar53 = auVar45._4_4_;
      auVar29._4_4_ = -(uint)(iVar53 == -1);
      iVar54 = auVar45._8_4_;
      iVar55 = auVar45._12_4_;
      auVar29._8_4_ = -(uint)(iVar54 == -1);
      auVar29._12_4_ = -(uint)(iVar55 == -1);
      auVar47 = blendvps(auVar40,local_158,auVar29);
      auVar5._4_4_ = iVar19;
      auVar5._0_4_ = iVar19;
      auVar5._8_4_ = iVar19;
      auVar5._12_4_ = iVar19;
      auVar52 = blendvps(auVar52,auVar5,auVar29);
      auVar50 = blendvps(auVar49,auVar5,auVar29);
      iVar34 = auVar47._0_4_;
      iVar28 = auVar47._4_4_;
      iVar33 = auVar47._12_4_;
      iVar32 = auVar47._8_4_;
      if (3 < uVar16) {
        local_1a8 = (uint)(iVar34 < (int)local_1a8) * iVar34 |
                    (iVar34 >= (int)local_1a8) * local_1a8;
        uStack_1a4 = (uint)(iVar28 < (int)uStack_1a4) * iVar28 |
                     (iVar28 >= (int)uStack_1a4) * uStack_1a4;
        uStack_1a0 = (uint)(iVar32 < (int)uStack_1a0) * iVar32 |
                     (iVar32 >= (int)uStack_1a0) * uStack_1a0;
        uStack_19c = (uint)(iVar33 < (int)uStack_19c) * iVar33 |
                     (iVar33 >= (int)uStack_19c) * uStack_19c;
        local_1b8._4_4_ =
             (uint)((int)local_1b8._4_4_ < iVar28) * iVar28 |
             (uint)((int)local_1b8._4_4_ >= iVar28) * local_1b8._4_4_;
        local_1b8._0_4_ =
             (uint)((int)local_1b8._0_4_ < iVar34) * iVar34 |
             (uint)((int)local_1b8._0_4_ >= iVar34) * local_1b8._0_4_;
        local_1b8._8_4_ =
             (uint)((int)local_1b8._8_4_ < iVar32) * iVar32 |
             (uint)((int)local_1b8._8_4_ >= iVar32) * local_1b8._8_4_;
        local_1b8._12_4_ =
             (uint)((int)local_1b8._12_4_ < iVar33) * iVar33 |
             (uint)((int)local_1b8._12_4_ >= iVar33) * local_1b8._12_4_;
      }
      piVar3 = ((ppVar7->field_4).rowcols)->score_row;
      if (uVar16 < uVar26) {
        *(int *)((long)piVar3 + uVar16 * 4 + local_170) = iVar33;
      }
      if (uVar16 - 1 < uVar26 && (long)local_178 < lVar27) {
        *(int *)((long)piVar3 + uVar16 * 4 + local_f0) = iVar32;
      }
      if (((long)local_180 < lVar27) && ((long)(uVar16 - 2) < (long)uVar26 && 1 < uVar16)) {
        *(int *)((long)piVar3 + uVar16 * 4 + local_f8) = iVar28;
      }
      if (2 < uVar16 && (long)uVar25 < lVar27) {
        *(int *)((long)piVar3 + uVar16 * 4 + local_168) = iVar34;
      }
      auVar35._0_4_ = -(uint)(iVar56 < iVar15);
      auVar35._4_4_ = -(uint)(iVar58 < iVar15);
      auVar35._8_4_ = -(uint)(iVar21 < iVar15);
      auVar35._12_4_ = -(uint)(iVar59 < iVar15);
      auVar30._0_4_ = -(uint)(iVar51 < s2Len);
      auVar30._4_4_ = -(uint)(iVar53 < s2Len);
      auVar30._8_4_ = -(uint)(iVar54 < s2Len);
      auVar30._12_4_ = -(uint)(iVar55 < s2Len);
      auVar38._0_4_ = -(uint)(auVar36._0_4_ < iVar34);
      auVar38._4_4_ = -(uint)(auVar36._4_4_ < iVar28);
      auVar38._8_4_ = -(uint)(auVar36._8_4_ < iVar32);
      auVar38._12_4_ = -(uint)(auVar36._12_4_ < iVar33);
      auVar38 = ~auVar45 & auVar30 & auVar48 & auVar38;
      local_128 = blendvps(auVar36,auVar40,auVar38);
      auVar41._0_4_ = -(uint)(s2Len + -1 == iVar51);
      auVar41._4_4_ = -(uint)(s2Len + -1 == iVar53);
      auVar41._8_4_ = -(uint)(s2Len + -1 == iVar54);
      auVar41._12_4_ = -(uint)(s2Len + -1 == iVar55);
      auVar36._0_4_ = -(uint)(auVar31._0_4_ < iVar34);
      auVar36._4_4_ = -(uint)(auVar31._4_4_ < iVar28);
      auVar36._8_4_ = -(uint)(auVar31._8_4_ < iVar32);
      auVar36._12_4_ = -(uint)(auVar31._12_4_ < iVar33);
      auVar36 = auVar35 & auVar41 & auVar36;
      local_138 = blendvps(auVar31,auVar47,auVar36);
      local_c8 = blendvps(local_c8,auVar47,auVar41 & auVar48);
      ptr_00[uVar16] = iVar34;
      ptr_01[uVar16] = auVar52._0_4_;
      local_148 = blendvps(local_148,auVar57,auVar36);
      local_48 = blendvps(local_48,auVar45,auVar38);
      auVar45._0_4_ = iVar51 + 1;
      auVar45._4_4_ = iVar53 + 1;
      auVar45._8_4_ = iVar54 + 1;
      auVar45._12_4_ = iVar55 + 1;
      auVar37._12_4_ = iVar1;
      auVar37._0_12_ = auVar46._4_12_;
      auVar46 = auVar47;
      auVar31 = local_138;
      auVar36 = local_128;
    }
    auVar57._0_4_ = iVar56 + 4;
    auVar57._4_4_ = iVar58 + 4;
    auVar57._8_4_ = iVar21 + 4;
    auVar57._12_4_ = iVar59 + 4;
    local_158._4_4_ = local_158._4_4_ - iStack_d4;
    local_158._0_4_ = local_158._0_4_ - local_d8;
    local_158._8_4_ = local_158._8_4_ - iStack_d0;
    local_158._12_4_ = local_158._12_4_ - iStack_cc;
    local_168 = local_168 + local_108;
    local_170 = local_170 + local_108;
    uVar16 = local_100;
  }
  iVar15 = 0;
  uVar17 = 0;
  iVar23 = iVar19;
  iVar56 = iVar19;
  iVar20 = iVar19;
  for (lVar27 = 0; (int)lVar27 != 4; lVar27 = lVar27 + 1) {
    iVar58 = *(int *)(local_138 + lVar27 * 4);
    if (iVar56 < iVar58) {
      uVar17 = *(uint *)(local_148 + lVar27 * 4);
      iVar56 = iVar58;
    }
    else if ((iVar58 == iVar56) && ((int)*(uint *)(local_148 + lVar27 * 4) < (int)uVar17)) {
      uVar17 = *(uint *)(local_148 + lVar27 * 4);
      iVar56 = iVar58;
    }
    if (iVar23 < *(int *)(local_128 + lVar27 * 4)) {
      iVar15 = *(int *)(local_48 + lVar27 * 4);
      iVar23 = *(int *)(local_128 + lVar27 * 4);
    }
    if (iVar20 < *(int *)(local_c8 + lVar27 * 4)) {
      iVar20 = *(int *)(local_c8 + lVar27 * 4);
    }
  }
  iVar58 = iVar15;
  if (s1_end == 0 || s2_end == 0) {
    iVar21 = s2Len + -1;
    if (s1_end != 0) goto LAB_0065e805;
    iVar58 = iVar21;
    if (s2_end != 0) {
      iVar20 = iVar23;
      iVar58 = iVar15;
    }
  }
  else {
    if (iVar23 < iVar56) {
      iVar15 = s2Len + -1;
      iVar21 = iVar15;
      goto LAB_0065e805;
    }
    iVar20 = iVar23;
    if ((iVar56 == iVar23) && (iVar21 = s2Len + -1, iVar15 == s2Len + -1)) goto LAB_0065e805;
  }
  iVar56 = iVar20;
  uVar17 = uVar8;
  iVar21 = iVar58;
LAB_0065e805:
  auVar31._0_4_ = -(uint)((int)local_1a8 < iVar19);
  auVar31._4_4_ = -(uint)((int)uStack_1a4 < iVar19);
  auVar31._8_4_ = -(uint)((int)uStack_1a0 < iVar19);
  auVar31._12_4_ = -(uint)((int)uStack_19c < iVar19);
  auVar47._0_4_ = -(uint)((int)uVar18 < (int)local_1b8._0_4_);
  auVar47._4_4_ = -(uint)((int)uVar18 < (int)local_1b8._4_4_);
  auVar47._8_4_ = -(uint)((int)uVar18 < (int)local_1b8._8_4_);
  auVar47._12_4_ = -(uint)((int)uVar18 < (int)local_1b8._12_4_);
  iVar19 = movmskps(iVar15,auVar47 | auVar31);
  if (iVar19 != 0) {
    *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
    iVar56 = 0;
    iVar21 = 0;
    uVar17 = 0;
  }
  ppVar7->score = iVar56;
  ppVar7->end_query = uVar17;
  ppVar7->end_ref = iVar21;
  local_b8 = auVar6;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_1e0);
    return ppVar7;
  }
  return ppVar7;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}